

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O0

FieldSubset * __thiscall
capnp::StructSchema::getNonUnionFields(FieldSubset *__return_storage_ptr__,StructSchema *this)

{
  Reader list;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  StructSchema local_b0;
  uint local_a8;
  ushort local_a2;
  uint size;
  uint16_t offset;
  Reader fields;
  undefined1 local_40 [8];
  Reader proto;
  StructSchema *this_local;
  
  proto._reader._40_8_ = this;
  Schema::getProto((Reader *)&fields.reader.nestingLimit,&this->super_Schema);
  capnp::schema::Node::Reader::getStruct((Reader *)local_40,(Reader *)&fields.reader.nestingLimit);
  capnp::schema::Node::Struct::Reader::getFields((Reader *)&size,(Reader *)local_40);
  local_a2 = capnp::schema::Node::Struct::Reader::getDiscriminantCount((Reader *)local_40);
  local_a8 = List<capnp::schema::Field,_(capnp::Kind)3>::Reader::size((Reader *)&size);
  local_a8 = local_a8 - local_a2;
  local_b0 = (StructSchema)(this->super_Schema).raw;
  memcpy(&local_e0,&size,0x30);
  list.reader.capTable = (CapTableReader *)uStack_d8;
  list.reader.segment = (SegmentReader *)local_e0;
  list.reader.ptr = (byte *)local_d0;
  list.reader.elementCount = (undefined4)uStack_c8;
  list.reader.step = uStack_c8._4_4_;
  list.reader.structDataSize = (undefined4)local_c0;
  list.reader.structPointerCount = local_c0._4_2_;
  list.reader.elementSize = local_c0._6_1_;
  list.reader._39_1_ = local_c0._7_1_;
  list.reader._40_8_ = uStack_b8;
  FieldSubset::FieldSubset
            (__return_storage_ptr__,local_b0,list,
             ((this->super_Schema).raw)->generic->membersByDiscriminant + (int)(uint)local_a2,
             local_a8);
  return __return_storage_ptr__;
}

Assistant:

StructSchema::FieldSubset StructSchema::getNonUnionFields() const {
  auto proto = getProto().getStruct();
  auto fields = proto.getFields();
  auto offset = proto.getDiscriminantCount();
  auto size = fields.size() - offset;
  return FieldSubset(*this, fields, raw->generic->membersByDiscriminant + offset, size);
}